

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mipmap.cpp
# Opt level: O1

RGB __thiscall pbrt::MIPMap::Lookup<pbrt::RGB>(MIPMap *this,Point2f *st,Float width)

{
  Tuple2<pbrt::Point2,_float> st_00;
  FilterFunction FVar1;
  uint uVar2;
  Point2i PVar3;
  undefined4 extraout_var;
  Tuple2<pbrt::Point2,_int> st_01;
  uint level;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  float fVar6;
  undefined1 auVar7 [16];
  undefined8 uVar9;
  undefined1 in_register_00001204 [60];
  undefined1 auVar8 [64];
  undefined1 auVar10 [12];
  undefined1 in_ZMM2 [64];
  undefined1 auVar11 [16];
  undefined1 in_register_00001344 [12];
  RGB RVar12;
  RGB RVar13;
  RGB RVar14;
  int vb;
  Float va;
  undefined1 local_38 [16];
  undefined8 local_28;
  undefined8 uStack_20;
  
  auVar10 = in_ZMM2._4_12_;
  auVar8._4_60_ = in_register_00001204;
  auVar8._0_4_ = width;
  local_38._0_4_ = (float)((int)(this->pyramid).nStored + -1);
  auVar7 = vmaxss_avx(SUB6416(ZEXT464(0x322bcc77),0),auVar8._0_16_);
  fVar6 = logf(auVar7._0_4_);
  fVar6 = fVar6 * 1.442695 + (float)local_38._0_4_;
  level = (int)(this->pyramid).nStored - 1;
  if ((float)(int)level <= fVar6) {
    st_01.x = 0;
    st_01.y = 0;
LAB_003bb07e:
    RVar12 = Texel<pbrt::RGB>(this,level,(Point2i)st_01);
    return RVar12;
  }
  auVar7 = vroundss_avx(ZEXT416((uint)fVar6),ZEXT416((uint)fVar6),9);
  uVar2 = (uint)auVar7._0_4_;
  level = ~((int)uVar2 >> 0x1f) & uVar2;
  FVar1 = (this->options).filter;
  if (FVar1 == Trilinear) {
    if (0 < (int)uVar2) {
      va = fVar6 - (float)(int)level;
      vb = 1;
      local_38 = ZEXT416((uint)va);
      if (va <= 1.0) {
        uVar9 = 0;
        RVar12 = Bilerp<pbrt::RGB>(this,level,(Point2f)st->super_Tuple2<pbrt::Point2,_float>);
        local_28 = RVar12._0_8_;
        uStack_20 = uVar9;
        RVar13 = Bilerp<pbrt::RGB>(this,level + 1,(Point2f)st->super_Tuple2<pbrt::Point2,_float>);
        fVar6 = 1.0 - (float)local_38._0_4_;
        RVar14.r = fVar6 * (float)local_28 + (float)local_38._0_4_ * RVar13.r;
        RVar14.g = fVar6 * local_28._4_4_ + (float)local_38._0_4_ * RVar13.g;
        RVar14.b = fVar6 * RVar12.b + (float)local_38._0_4_ * RVar13.b;
        return RVar14;
      }
      LogFatal<char_const(&)[6],char_const(&)[2],char_const(&)[6],float&,char_const(&)[2],int&>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/mipmap.cpp"
                 ,0xf8,"Check failed: %s <= %s with %s = %s, %s = %s",(char (*) [6])0x460260,
                 (char (*) [2])0x2d277c0,(char (*) [6])0x460260,&va,(char (*) [2])0x2d277c0,&vb);
    }
    st_00 = st->super_Tuple2<pbrt::Point2,_float>;
    level = 0;
  }
  else {
    if (FVar1 != Bilinear) {
      if (FVar1 != Point) {
        LogFatal<char_const(&)[44]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/mipmap.cpp"
                   ,0xf2,"Check failed: %s",
                   (char (*) [44])"options.filter == FilterFunction::Trilinear");
      }
      PVar3 = LevelResolution(this,level);
      auVar7._0_4_ = (float)PVar3.super_Tuple2<pbrt::Point2,_int>.x;
      auVar7._4_12_ = auVar10;
      auVar5._8_4_ = 0x80000000;
      auVar5._0_8_ = 0x8000000080000000;
      auVar5._12_4_ = 0x80000000;
      auVar7 = vfmadd132ss_fma(auVar7,SUB6416(ZEXT464(0xbf000000),0),
                               ZEXT416((uint)(st->super_Tuple2<pbrt::Point2,_float>).x));
      auVar11._8_4_ = 0x3effffff;
      auVar11._0_8_ = 0x3effffff3effffff;
      auVar11._12_4_ = 0x3effffff;
      auVar4 = vpternlogd_avx512vl(auVar11,auVar7,auVar5,0xf8);
      auVar7 = ZEXT416((uint)(auVar7._0_4_ + auVar4._0_4_));
      auVar7 = vroundss_avx(auVar7,auVar7,0xb);
      auVar4._0_4_ = (float)PVar3.super_Tuple2<pbrt::Point2,_int>.y;
      auVar4._4_12_ = in_register_00001344;
      auVar4 = vfmadd132ss_fma(auVar4,SUB6416(ZEXT464(0xbf000000),0),
                               ZEXT416((uint)(st->super_Tuple2<pbrt::Point2,_float>).y));
      auVar5 = vpternlogd_avx512vl(auVar11,auVar4,auVar5,0xf8);
      auVar4 = ZEXT416((uint)(auVar4._0_4_ + auVar5._0_4_));
      auVar4 = vroundss_avx(auVar4,auVar4,0xb);
      st_01 = (Tuple2<pbrt::Point2,_int>)
              (CONCAT44(extraout_var,(int)auVar7._0_4_) | (ulong)(uint)(int)auVar4._0_4_ << 0x20);
      goto LAB_003bb07e;
    }
    st_00 = st->super_Tuple2<pbrt::Point2,_float>;
  }
  RVar12 = Bilerp<pbrt::RGB>(this,level,(Point2f)st_00);
  return RVar12;
}

Assistant:

T MIPMap::Lookup(const Point2f &st, Float width) const {
    // Compute MIPMap level
    int nLevels = Levels();
    Float level = nLevels - 1 + Log2(std::max<Float>(width, 1e-8));

    if (level >= Levels() - 1)
        return Texel<T>(Levels() - 1, {0, 0});

    int iLevel = std::max(0, int(std::floor(level)));
    if (options.filter == FilterFunction::Point) {
        Point2i resolution = LevelResolution(iLevel);
        Point2i sti(std::round(st[0] * resolution[0] - 0.5f),
                    std::round(st[1] * resolution[1] - 0.5f));
        return Texel<T>(iLevel, sti);
    } else if (options.filter == FilterFunction::Bilinear) {
        return Bilerp<T>(iLevel, st);
    } else {
        CHECK(options.filter == FilterFunction::Trilinear);

        if (iLevel == 0)
            return Bilerp<T>(0, st);
        else {
            Float delta = level - iLevel;
            CHECK_LE(delta, 1);
            return Lerp(delta, Bilerp<T>(iLevel, st), Bilerp<T>(iLevel + 1, st));
        }
    }
}